

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O3

OffsetDataList * __thiscall
QTimeZone::transitions
          (OffsetDataList *__return_storage_ptr__,QTimeZone *this,QDateTime *fromDateTime,
          QDateTime *toDateTime)

{
  QTimeZonePrivate *this_00;
  Data *pDVar1;
  OffsetData *pOVar2;
  qsizetype qVar3;
  bool bVar4;
  qint64 fromMSecsSinceEpoch;
  qint64 toMSecsSinceEpoch;
  long lVar5;
  Data *data;
  long in_FS_OFFSET;
  QArrayDataPointer<QTimeZonePrivate::Data> local_a8;
  QArrayDataPointer<QTimeZone::OffsetData> local_88;
  Data local_68 [3];
  QDateTime local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.d = (Data *)0x0;
  local_88.ptr = (OffsetData *)0x0;
  local_88.size = 0;
  if (((ulong)(this->d).d & 3) == 0) {
    bVar4 = hasTransitions(this);
    if (bVar4) {
      local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      this_00 = (this->d).d;
      fromMSecsSinceEpoch = QDateTime::toMSecsSinceEpoch(fromDateTime);
      toMSecsSinceEpoch = QDateTime::toMSecsSinceEpoch(toDateTime);
      QTimeZonePrivate::transitions
                ((DataList *)&local_a8,this_00,fromMSecsSinceEpoch,toMSecsSinceEpoch);
      QList<QTimeZone::OffsetData>::reserve((QList<QTimeZone::OffsetData> *)&local_88,local_a8.size)
      ;
      if ((undefined1 *)local_a8.size != (undefined1 *)0x0) {
        lVar5 = local_a8.size * 0x30;
        data = local_a8.ptr;
        do {
          QTimeZonePrivate::toOffsetData((OffsetData *)&local_68[0].s,data);
          QtPrivate::QMovableArrayOps<QTimeZone::OffsetData>::emplace<QTimeZone::OffsetData>
                    ((QMovableArrayOps<QTimeZone::OffsetData> *)&local_88,local_88.size,
                     (OffsetData *)&local_68[0].s);
          QList<QTimeZone::OffsetData>::end((QList<QTimeZone::OffsetData> *)&local_88);
          QDateTime::~QDateTime(local_50);
          if (local_68[0].d != (QTimeZonePrivate *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&(local_68[0].d)->_vptr_QTimeZonePrivate)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&(local_68[0].d)->_vptr_QTimeZonePrivate)->_q_value).
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&(local_68[0].d)->_vptr_QTimeZonePrivate)->_q_value).
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_68[0].d,2,0x10);
            }
          }
          data = data + 1;
          lVar5 = lVar5 + -0x30;
        } while (lVar5 != 0);
      }
      QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_a8);
    }
  }
  else if (((int)(this->d).d - 1U & 3) == 0) {
    systemTimeZone();
    transitions(__return_storage_ptr__,(QTimeZone *)&local_68[0].s,fromDateTime,toDateTime);
    ~QTimeZone((QTimeZone *)&local_68[0].s);
    goto LAB_003511a7;
  }
  qVar3 = local_88.size;
  pOVar2 = local_88.ptr;
  pDVar1 = local_88.d;
  local_88.d = (Data *)0x0;
  local_88.ptr = (OffsetData *)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = pOVar2;
  local_88.size = 0;
  (__return_storage_ptr__->d).size = qVar3;
LAB_003511a7:
  QArrayDataPointer<QTimeZone::OffsetData>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTimeZone::OffsetDataList QTimeZone::transitions(const QDateTime &fromDateTime,
                                                 const QDateTime &toDateTime) const
{
    OffsetDataList list;
    if (d.isShort()) {
        switch (d.s.spec()) {
        case Qt::LocalTime:
            return systemTimeZone().transitions(fromDateTime, toDateTime);
        case Qt::UTC:
        case Qt::OffsetFromUTC:
            break;
        case Qt::TimeZone:
            Q_UNREACHABLE();
            break;
        }
    } else if (hasTransitions()) {
        const QTimeZonePrivate::DataList plist = d->transitions(fromDateTime.toMSecsSinceEpoch(),
                                                                toDateTime.toMSecsSinceEpoch());
        list.reserve(plist.size());
        for (const QTimeZonePrivate::Data &pdata : plist)
            list.append(QTimeZonePrivate::toOffsetData(pdata));
    }
    return list;
}